

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseMessage.cpp
# Opt level: O1

bool __thiscall
SGParser::Generator::ParseMessageBuffer::PrintMessages
          (ParseMessageBuffer *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *stringBuffer,uint flags)

{
  Messages *pMVar1;
  pointer pPVar2;
  uint in_ECX;
  ParseMessageBuffer *pPVar3;
  pointer source;
  undefined1 local_50 [8];
  String msg;
  
  pMVar1 = this->pMessages;
  if (pMVar1 != (Messages *)0x0) {
    pPVar3 = (ParseMessageBuffer *)stringBuffer;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_erase_at_end(stringBuffer,
                      (stringBuffer->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start);
    source = (this->pMessages->
             super__Vector_base<SGParser::Generator::ParseMessage,_std::allocator<SGParser::Generator::ParseMessage>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pPVar2 = (this->pMessages->
             super__Vector_base<SGParser::Generator::ParseMessage,_std::allocator<SGParser::Generator::ParseMessage>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    if (source != pPVar2) {
      local_50 = (undefined1  [8])pPVar3;
      do {
        msg._M_dataplus._M_p = (pointer)0x0;
        msg._M_string_length._0_1_ = 0;
        pPVar3 = (ParseMessageBuffer *)local_50;
        local_50 = (undefined1  [8])&msg._M_string_length;
        PrintMessage(pPVar3,(String *)local_50,source,in_ECX);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(stringBuffer,(String *)local_50);
        if (local_50 != (undefined1  [8])&msg._M_string_length) {
          operator_delete((void *)local_50,
                          CONCAT71(msg._M_string_length._1_7_,(undefined1)msg._M_string_length) + 1)
          ;
        }
        source = source + 1;
      } while (source != pPVar2);
    }
  }
  return pMVar1 != (Messages *)0x0;
}

Assistant:

bool ParseMessageBuffer::PrintMessages(std::vector<String>& stringBuffer,
                                       [[maybe_unused]] unsigned flags) const {
    // Make sure we have a valid message buffer
    if (!pMessages)
        return false;

    stringBuffer.clear();

    // Build the list of message strings
    for (const auto& message: *pMessages) {
        String msg;
        PrintMessage(msg, message, 0u);
        stringBuffer.push_back(msg);
    }

    return true;
}